

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O1

RegressionLine *
ZXing::QRCode::TraceLine
          (RegressionLine *__return_storage_ptr__,BitMatrix *image,PointF p,PointF d,int edge)

{
  Direction dir;
  bool bVar1;
  Value VVar2;
  PointT<int> d_00;
  PointT<int> d_01;
  PointT<int> d_02;
  PointT<int> d_03;
  long lVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  PointF PVar10;
  double dVar11;
  double dVar12;
  BitMatrixCursorI c;
  BitMatrixCursor<ZXing::PointT<int>_> local_b8;
  BitMatrixCursor<ZXing::PointT<double>_> local_a0;
  Direction local_78 [2];
  BitMatrixCursor<ZXing::PointT<int>_> local_70;
  undefined1 local_58 [16];
  PointF local_48;
  
  local_a0.p.y = p.y;
  local_a0.p.x = p.x;
  auVar8._0_8_ = d.x - local_a0.p.x;
  auVar8._8_8_ = d.y - local_a0.p.y;
  dVar5 = ABS(auVar8._8_8_);
  if (ABS(auVar8._8_8_) <= ABS(auVar8._0_8_)) {
    dVar5 = ABS(auVar8._0_8_);
  }
  auVar7._8_8_ = dVar5;
  auVar7._0_8_ = dVar5;
  local_a0.d = (PointT<double>)divpd(auVar8,auVar7);
  local_a0.img = image;
  local_48 = p;
  RegressionLine::RegressionLine(__return_storage_ptr__);
  auVar9._0_8_ = -local_a0.d.x;
  auVar9._8_8_ = -local_a0.d.y;
  dVar5 = local_a0.d.x * local_a0.d.x + local_a0.d.y * local_a0.d.y;
  if (dVar5 < 0.0) {
    local_58 = auVar9;
    dVar5 = sqrt(dVar5);
    auVar9 = local_58;
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  auVar6._8_8_ = dVar5;
  auVar6._0_8_ = dVar5;
  PVar10 = (PointF)divpd(auVar9,auVar6);
  __return_storage_ptr__->_directionInward = PVar10;
  BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge(&local_a0,edge,0,edge == 3);
  if (edge == 3) {
    local_a0.d.y = -local_a0.d.y;
    local_a0.d.x = -local_a0.d.x;
  }
  dVar11 = local_a0.d.x;
  dVar5 = SUB168(_DAT_001942a0 & (undefined1  [16])local_a0.d,8);
  dVar12 = SUB168(_DAT_001942a0 & (undefined1  [16])local_a0.d,0);
  if (dVar12 <= dVar5) {
    dVar11 = 0.0;
  }
  local_b8.p.x = (int)local_a0.p.x;
  local_b8.p.y = (int)local_a0.p.y;
  local_a0.img = (BitMatrix *)
                 CONCAT44((int)(double)(~-(ulong)(dVar5 < dVar12) & (ulong)local_a0.d.y),(int)dVar11
                         );
  d_00.y = -local_b8.d.y;
  d_00.x = -local_b8.d.x;
  local_b8.img = image;
  VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_00);
  while (VVar2.v == -1) {
    d_01.y = -local_b8.d.x;
    d_01.x = local_b8.d.y;
    VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_01);
    d_02.y = local_b8.d.x;
    d_02.x = -local_b8.d.y;
    if (VVar2.v == -1) {
      VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_02);
      if (VVar2.v == -1) {
        iVar4 = local_b8.p.y;
        local_b8.p.x = local_b8.p.x - local_b8.d.x;
        local_b8.p.y = iVar4 - local_b8.d.y;
        d_02 = local_b8.d;
      }
      else {
        d_02.y = -local_b8.d.x;
        d_02.x = local_b8.d.y;
      }
    }
    local_b8.d = d_02;
    d_03.y = -local_b8.d.y;
    d_03.x = -local_b8.d.x;
    VVar2 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAt(&local_b8,d_03);
  }
  local_78[0] = LEFT;
  local_78[1] = RIGHT;
  lVar3 = 0;
  do {
    dir = *(Direction *)((long)local_78 + lVar3);
    local_70.d.x = -(local_b8.d.y * dir);
    local_70.d.y = local_b8.d.x * dir;
    local_70.p = local_b8.p;
    dVar5 = ABS(local_a0.p.y - local_48.y);
    if (ABS(local_a0.p.y - local_48.y) <= ABS(local_a0.p.x - local_48.x)) {
      dVar5 = ABS(local_a0.p.x - local_48.x);
    }
    iVar4 = (int)dVar5 + 1;
    local_70.img = image;
    do {
      PVar10.x = (double)local_70.p.x + 0.5;
      PVar10.y = (double)local_70.p.y + 0.5;
      RegressionLine::add(__return_storage_ptr__,PVar10);
      iVar4 = iVar4 + -1;
      if (iVar4 < 2) break;
      bVar1 = BitMatrixCursor<ZXing::PointT<int>_>::stepAlongEdge(&local_70,dir,true);
    } while (bVar1);
    lVar3 = lVar3 + 4;
    if (lVar3 == 8) {
      RegressionLine::evaluate(__return_storage_ptr__,1.0,true);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static RegressionLine TraceLine(const BitMatrix& image, PointF p, PointF d, int edge)
{
	BitMatrixCursorF cur(image, p, d - p);
	RegressionLine line;
	line.setDirectionInward(cur.back());

	// collect points inside the black line -> backup on 3rd edge
	cur.stepToEdge(edge, 0, edge == 3);
	if (edge == 3)
		cur.turnBack();

	auto curI = BitMatrixCursorI(image, PointI(cur.p), PointI(mainDirection(cur.d)));
	// make sure curI positioned such that the white->black edge is directly behind
	// Test image: fix-traceline.jpg
	while (!curI.edgeAtBack()) {
		if (curI.edgeAtLeft())
			curI.turnRight();
		else if (curI.edgeAtRight())
			curI.turnLeft();
		else
			curI.step(-1);
	}

	for (auto dir : {Direction::LEFT, Direction::RIGHT}) {
		auto c = BitMatrixCursorI(image, curI.p, curI.direction(dir));
		auto stepCount = static_cast<int>(maxAbsComponent(cur.p - p));
		do {
			line.add(centered(c.p));
		} while (--stepCount > 0 && c.stepAlongEdge(dir, true));
	}

	line.evaluate(1.0, true);

	for (auto p : line.points())
		log(p, 2);

	return line;
}